

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

int sx_strlen(char *str)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *char_ptr;
  
  uVar4 = -(int)str & 7;
  iVar3 = -1;
  pcVar5 = str;
  pcVar6 = str;
  while (((ulong)pcVar5 & 7) != 0) {
    iVar3 = iVar3 + 1;
    pcVar5 = pcVar5 + 1;
    cVar1 = *pcVar6;
    pcVar6 = pcVar6 + 1;
    if (cVar1 == '\0') {
      return iVar3;
    }
  }
  iVar3 = 0;
  do {
    uVar2 = *(ulong *)(str + uVar4);
    if ((~(0x101010101010100 - uVar2 | uVar2) & 0x8080808080808080) != 0) {
      if ((char)uVar2 == '\0') {
        return uVar4 + iVar3;
      }
      if ((uVar2 & 0xff00) == 0) {
        return iVar3 + uVar4 + 1;
      }
      if ((uVar2 & 0xff0000) == 0) {
        return iVar3 + uVar4 + 2;
      }
      if ((char)(uVar2 >> 0x18) == '\0') {
        return iVar3 + uVar4 + 3;
      }
      if ((char)(uVar2 >> 0x20) == '\0') {
        return iVar3 + uVar4 + 4;
      }
      if ((char)(uVar2 >> 0x28) == '\0') {
        return iVar3 + uVar4 + 5;
      }
      if ((char)(uVar2 >> 0x30) == '\0') {
        return iVar3 + uVar4 + 6;
      }
      if (uVar2 >> 0x38 == 0) {
        return iVar3 + uVar4 + 7;
      }
    }
    iVar3 = iVar3 + 8;
    str = str + 8;
  } while( true );
}

Assistant:

int sx_strlen(const char* str)
{
    const char* char_ptr;
    const uintptr_t* longword_ptr;
    uintptr_t longword, himagic, lomagic;

    for (char_ptr = str; ((uintptr_t)char_ptr & (sizeof(longword) - 1)) != 0; ++char_ptr) {
        if (*char_ptr == '\0')
            return (int)(intptr_t)(char_ptr - str);
    }
    longword_ptr = (uintptr_t*)char_ptr;
    himagic = 0x80808080L;
    lomagic = 0x01010101L;
#if SX_ARCH_64BIT
    /* 64-bit version of the magic.  */
    /* Do the shift in two steps to avoid a warning if long has 32 bits.  */
    himagic = ((himagic << 16) << 16) | himagic;
    lomagic = ((lomagic << 16) << 16) | lomagic;
#endif

    for (;;) {
        longword = *longword_ptr++;

        if (((longword - lomagic) & ~longword & himagic) != 0) {
            const char* cp = (const char*)(longword_ptr - 1);

            if (cp[0] == 0)
                return (int)(intptr_t)(cp - str);
            if (cp[1] == 0)
                return (int)(intptr_t)(cp - str + 1);
            if (cp[2] == 0)
                return (int)(intptr_t)(cp - str + 2);
            if (cp[3] == 0)
                return (int)(intptr_t)(cp - str + 3);
#if SX_ARCH_64BIT
            if (cp[4] == 0)
                return (int)(intptr_t)(cp - str + 4);
            if (cp[5] == 0)
                return (int)(intptr_t)(cp - str + 5);
            if (cp[6] == 0)
                return (int)(intptr_t)(cp - str + 6);
            if (cp[7] == 0)
                return (int)(intptr_t)(cp - str + 7);
#endif
        }
    }

    #if !SX_COMPILER_MSVC
    sx_assertf(0, "Not a null-terminated string");
    return -1;
    #endif
}